

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafmode.c
# Opt level: O2

errr finish_parse_grafmode(parser *p)

{
  undefined8 *puVar1;
  char *pcVar2;
  graphics_mode *pgVar3;
  graphics_mode *pgVar4;
  errr extraout_EAX;
  undefined8 *puVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  wchar_t local_44;
  
  if (p == (parser *)0x0) {
    local_44 = L'\0';
    uVar7 = 0;
  }
  else {
    puVar5 = (undefined8 *)parser_priv(p);
    local_44 = L'\0';
    uVar7 = 0;
    for (; puVar5 != (undefined8 *)0x0; puVar5 = (undefined8 *)*puVar5) {
      if ((uint)local_44 <= (uint)*(byte *)(puVar5 + 1)) {
        local_44 = (uint)*(byte *)(puVar5 + 1);
      }
      uVar7 = uVar7 + 1;
    }
  }
  if (graphics_modes != (graphics_mode *)0x0) {
    close_graphics_modes();
  }
  graphics_modes = (graphics_mode *)mem_zalloc((ulong)(uVar7 + 1) * 0x170);
  if (p != (parser *)0x0) {
    puVar5 = (undefined8 *)parser_priv(p);
    uVar8 = (ulong)uVar7;
    lVar6 = uVar8 * 0x170;
    for (; pgVar3 = graphics_modes, 0 < (long)uVar8; uVar8 = uVar8 - 1) {
      pcVar2 = graphics_modes->path;
      memcpy(pcVar2 + lVar6 + -0x10 + -0x170,puVar5,0x170);
      *(char **)(pgVar3[-1].path + lVar6 + -0x10) = pcVar2 + lVar6 + -0x10;
      puVar5 = (undefined8 *)*puVar5;
      lVar6 = lVar6 + -0x170;
    }
  }
  graphics_modes[uVar7].pNext = (_graphics_mode *)0x0;
  pgVar3 = graphics_modes + uVar7;
  pgVar4 = graphics_modes + uVar7;
  pgVar4->grafID = '\0';
  pgVar4->alphablend = '\0';
  pgVar4->overdrawRow = '\0';
  pgVar4->overdrawMax = '\0';
  my_strcpy(pgVar3->pref,"none",8);
  my_strcpy(graphics_modes[uVar7].path,"",0x20);
  my_strcpy(graphics_modes[uVar7].file,"",0x20);
  my_strcpy(graphics_modes[uVar7].menuname,"None",0x20);
  current_graphics_mode = graphics_modes + uVar7;
  graphics_mode_high_id = local_44;
  if (p == (parser *)0x0) {
    return local_44;
  }
  puVar5 = (undefined8 *)parser_priv(p);
  while (puVar5 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*puVar5;
    mem_free(puVar5);
    puVar5 = puVar1;
  }
  parser_setpriv(p,(void *)0x0);
  parser_destroy(p);
  return extraout_EAX;
}

Assistant:

static errr finish_parse_grafmode(struct parser *p) {
	graphics_mode *mode, *n;
	int max = 0;
	int count = 0;
	int i;
	
	/* See how many graphics modes we have and what the highest index is */
	if (p) {
		mode = parser_priv(p);
		while (mode) {
			if (mode->grafID > max) {
				max = mode->grafID;
			}
			count++;
			mode = mode->pNext;
		}
	}

	/* Copy the loaded modes to the global variable */
	if (graphics_modes) {
		close_graphics_modes();
	}

	graphics_modes = mem_zalloc(sizeof(graphics_mode) * (count+1));
	if (p) {
		mode = parser_priv(p);
		for (i = count-1; i >= 0; i--, mode = mode->pNext) {
			memcpy(&(graphics_modes[i]), mode, sizeof(graphics_mode));
			graphics_modes[i].pNext = &(graphics_modes[i+1]);
		}
	}

	/* Hardcode the no graphics option */
	graphics_modes[count].pNext = NULL;
	graphics_modes[count].grafID = GRAPHICS_NONE;
	graphics_modes[count].alphablend = 0;
	graphics_modes[count].overdrawRow = 0;
	graphics_modes[count].overdrawMax = 0;
	my_strcpy(graphics_modes[count].pref, "none", 8);
	my_strcpy(graphics_modes[count].path, "", 32);
	my_strcpy(graphics_modes[count].file, "", 32);
	my_strcpy(graphics_modes[count].menuname, "None", 32);

	graphics_mode_high_id = max;

	/* Set the default graphics mode to be no graphics */
	current_graphics_mode = &(graphics_modes[count]);

	if (p) {
		mode = parser_priv(p);
		while (mode) {
			n = mode->pNext;
			mem_free(mode);
			mode = n;
		}
	
		parser_setpriv(p, NULL);
		parser_destroy(p);
	}
	return PARSE_ERROR_NONE;
}